

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O3

void __thiscall fmt::v8::detail::utf8_to_utf16::utf8_to_utf16(utf8_to_utf16 *this,string_view s)

{
  wchar_t *pwVar1;
  char *pcVar2;
  size_t sVar3;
  char *pcVar4;
  char *ptr;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  anon_class_8_1_54a39806 decode;
  char *pcVar5;
  ulong uVar6;
  type size;
  size_t __n;
  char local_30 [8];
  
  pcVar4 = (char *)s.size_;
  pcVar5 = s.data_;
  (this->buffer_).super_buffer<wchar_t>.size_ = 0;
  (this->buffer_).super_buffer<wchar_t>._vptr_buffer = (_func_int **)&PTR_grow_0031fa50;
  (this->buffer_).super_buffer<wchar_t>.ptr_ = (this->buffer_).store_;
  (this->buffer_).super_buffer<wchar_t>.capacity_ = 500;
  pcVar2 = pcVar5;
  if (pcVar4 < (char *)0x4) {
LAB_00267769:
    __n = (long)(pcVar5 + (long)pcVar4) - (long)pcVar2;
    if (__n != 0) {
      local_30[4] = '\0';
      local_30[5] = '\0';
      local_30[6] = '\0';
      local_30[0] = '\0';
      local_30[1] = '\0';
      local_30[2] = '\0';
      local_30[3] = '\0';
      memcpy(local_30,pcVar2,__n);
      pcVar2 = local_30;
      pcVar4 = extraout_RDX_00;
      do {
        pcVar2 = for_each_codepoint<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mrzv[P]henson/ext/fmt/include/fmt/format-inl.h:2548:25)>
                 ::anon_class_8_1_54a39806::operator()
                           ((anon_class_8_1_54a39806 *)this,pcVar2,pcVar4);
        if (pcVar2 == (char *)0x0) break;
        pcVar4 = extraout_RDX_01;
      } while ((long)pcVar2 - (long)local_30 < (long)__n);
    }
  }
  else {
    ptr = pcVar4;
    do {
      if (pcVar5 + (long)pcVar4 + -3 <= pcVar2) goto LAB_00267769;
      pcVar2 = for_each_codepoint<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mrzv[P]henson/ext/fmt/include/fmt/format-inl.h:2548:25)>
               ::anon_class_8_1_54a39806::operator()((anon_class_8_1_54a39806 *)this,pcVar2,ptr);
      ptr = extraout_RDX;
    } while (pcVar2 != (char *)0x0);
  }
  sVar3 = (this->buffer_).super_buffer<wchar_t>.size_;
  uVar6 = sVar3 + 1;
  if ((this->buffer_).super_buffer<wchar_t>.capacity_ < uVar6) {
    (**(this->buffer_).super_buffer<wchar_t>._vptr_buffer)(this);
    sVar3 = (this->buffer_).super_buffer<wchar_t>.size_;
    uVar6 = sVar3 + 1;
  }
  pwVar1 = (this->buffer_).super_buffer<wchar_t>.ptr_;
  (this->buffer_).super_buffer<wchar_t>.size_ = uVar6;
  pwVar1[sVar3] = L'\0';
  return;
}

Assistant:

FMT_FUNC detail::utf8_to_utf16::utf8_to_utf16(string_view s) {
  for_each_codepoint(s, [this](uint32_t cp, string_view) {
    if (cp == invalid_code_point) FMT_THROW(std::runtime_error("invalid utf8"));
    if (cp <= 0xFFFF) {
      buffer_.push_back(static_cast<wchar_t>(cp));
    } else {
      cp -= 0x10000;
      buffer_.push_back(static_cast<wchar_t>(0xD800 + (cp >> 10)));
      buffer_.push_back(static_cast<wchar_t>(0xDC00 + (cp & 0x3FF)));
    }
    return true;
  });
  buffer_.push_back(0);
}